

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fe_warp_inverse_linear.c
# Opt level: O1

float fe_warp_inverse_linear_warped_to_unwarped(float nonlinear)

{
  if (is_neutral == '\x01') {
    nonlinear = nonlinear * params[0];
    if (nyquist_frequency < nonlinear) {
      err_msg(ERR_WARN,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/fe/fe_warp_inverse_linear.c"
              ,0x97,"Warp factor %g results in frequency (%.1f) higher than Nyquist (%.1f)\n",
              (double)params[0],(double)nonlinear,(double)nyquist_frequency);
    }
  }
  return nonlinear;
}

Assistant:

float
fe_warp_inverse_linear_warped_to_unwarped(float nonlinear)
{
    if (is_neutral) {
        return nonlinear;
    }
    else {
        /* linear = nonlinear * a */
        float temp = nonlinear * params[0];
        if (temp > nyquist_frequency) {
            E_WARN
                ("Warp factor %g results in frequency (%.1f) higher than Nyquist (%.1f)\n",
                 params[0], temp, nyquist_frequency);
        }
        return temp;
    }
}